

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_signature_normalize
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sigout,
              secp256k1_ecdsa_signature *sigin)

{
  int i;
  long lVar1;
  uint uVar2;
  uint uVar3;
  secp256k1_scalar *r;
  uint local_20;
  uint local_1c;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_signature_normalize_cold_2();
  }
  else if (sigin != (secp256k1_ecdsa_signature *)0x0) {
    lVar1 = 0;
    r = (secp256k1_scalar *)0x0;
    do {
      uVar2 = (uint)sigin->data[lVar1] | (int)r << 8;
      local_1c = uVar2 - (uVar2 / 0xd + (uVar2 / 0xd) * 0xc);
      if (uVar2 < 0xd) {
        local_1c = uVar2;
      }
      r = (secp256k1_scalar *)(ulong)local_1c;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x20);
    secp256k1_scalar_verify(r);
    lVar1 = 0;
    uVar2 = 0;
    do {
      uVar3 = (uint)sigin->data[lVar1 + 0x20] | uVar2 << 8;
      uVar2 = uVar3 - (uVar3 / 0xd + (uVar3 / 0xd) * 0xc);
      if (uVar3 < 0xd) {
        uVar2 = uVar3;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x20);
    local_20 = uVar2;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar2);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar2);
    if (sigout == (secp256k1_ecdsa_signature *)0x0) {
      return (uint)(6 < uVar2);
    }
    if (6 < uVar2) {
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar2);
      local_20 = 0xd - uVar2;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)local_20);
    }
    secp256k1_ecdsa_signature_save(sigout,&local_1c,&local_20);
    return (uint)(6 < uVar2);
  }
  secp256k1_ecdsa_signature_normalize_cold_1();
  return 0;
}

Assistant:

int secp256k1_ecdsa_signature_normalize(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sigout, const secp256k1_ecdsa_signature *sigin) {
    secp256k1_scalar r, s;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sigin);
    ret = secp256k1_scalar_is_high(&s);
    if (sigout != NULL) {
        if (ret) {
            secp256k1_scalar_negate(&s, &s);
        }
        secp256k1_ecdsa_signature_save(sigout, &r, &s);
    }

    return ret;
}